

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlDictLookup(void)

{
  int iVar1;
  int iVar2;
  xmlDictPtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  int local_3c;
  int local_38;
  int n_len;
  int len;
  int n_name;
  xmlChar *name;
  int n_dict;
  xmlDictPtr dict;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 2; name._4_4_ = name._4_4_ + 1) {
    for (n_len = 0; n_len < 5; n_len = n_len + 1) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlDictPtr(name._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(n_len,1);
        local_38 = gen_int(local_3c,2);
        if (val_00 != (xmlChar *)0x0) {
          iVar2 = xmlStrlen(val_00);
          if (iVar2 < local_38) {
            local_38 = 0;
          }
        }
        val_01 = (xmlChar *)xmlDictLookup(val,val_00,local_38);
        desret_const_xmlChar_ptr(val_01);
        call_tests = call_tests + 1;
        des_xmlDictPtr(name._4_4_,val,0);
        des_const_xmlChar_ptr(n_len,val_00,1);
        des_int(local_3c,local_38,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDictLookup",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)name._4_4_);
          printf(" %d",(ulong)(uint)n_len);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlDictLookup(void) {
    int test_ret = 0;

    int mem_base;
    const xmlChar * ret_val;
    xmlDictPtr dict; /* dictionary */
    int n_dict;
    const xmlChar * name; /* string key */
    int n_name;
    int len; /* length of the key, if -1 it is recomputed */
    int n_len;

    for (n_dict = 0;n_dict < gen_nb_xmlDictPtr;n_dict++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        dict = gen_xmlDictPtr(n_dict, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        len = gen_int(n_len, 2);
        if ((name != NULL) &&
            (len > xmlStrlen(BAD_CAST name)))
            len = 0;

        ret_val = xmlDictLookup(dict, name, len);
        desret_const_xmlChar_ptr(ret_val);
        call_tests++;
        des_xmlDictPtr(n_dict, dict, 0);
        des_const_xmlChar_ptr(n_name, name, 1);
        des_int(n_len, len, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlDictLookup",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_dict);
            printf(" %d", n_name);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}